

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = (uint)pMem->flags;
  if ((pMem->flags & 0xd) == 0) {
    iVar3 = sqlite3Atoi64(pMem->z,(i64 *)pMem,pMem->n,pMem->enc);
    uVar2 = 4;
    if (iVar3 != 0) {
      lVar1 = (pMem->u).i;
      sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
      uVar2 = 8;
      if ((iVar3 == 1) && ((double)(pMem->u).i == (double)lVar1)) {
        (pMem->u).i = lVar1;
        uVar2 = 4;
      }
    }
    uVar4 = (uint)uVar2 | pMem->flags & 0x3e20;
  }
  pMem->flags = (u16)(uVar4 & 0xbfed);
  return uVar4 & 0xbfed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    int rc;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc);
    if( rc==0 ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      i64 i = pMem->u.i;
      sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
      if( rc==1 && sqlite3RealSameAsInt(pMem->u.r, i) ){
        pMem->u.i = i;
        MemSetTypeFlag(pMem, MEM_Int);
      }else{
        MemSetTypeFlag(pMem, MEM_Real);
      }
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}